

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.cc
# Opt level: O2

Datatype * __thiscall TypeFactory::getBase(TypeFactory *this,int4 s,type_metatype m)

{
  long lVar1;
  TypeArray *ct;
  Datatype *pDVar2;
  TypeBase tmp;
  Datatype local_50;
  
  if (s < 9) {
    if ((int)m < 3) goto LAB_002ac8ca;
    pDVar2 = this->typecache[s][m - TYPE_FLOAT];
  }
  else {
    if (m != TYPE_FLOAT) goto LAB_002ac8ca;
    if (s == 10) {
      lVar1 = 0x2b8;
    }
    else {
      if (s != 0x10) goto LAB_002ac8ca;
      lVar1 = 0x2c0;
    }
    pDVar2 = *(Datatype **)((long)(this->typecache + -2) + 8 + lVar1);
  }
  if (pDVar2 != (Datatype *)0x0) {
    return pDVar2;
  }
LAB_002ac8ca:
  if (s <= this->glb->max_basetype_size) {
    local_50.name._M_dataplus._M_p = (pointer)&local_50.name.field_2;
    local_50.name._M_string_length = 0;
    local_50.name.field_2._M_local_buf[0] = '\0';
    local_50.flags = 0;
    local_50.id = 0;
    local_50._vptr_Datatype = (_func_int **)&PTR_restoreXml_003f6248;
    local_50.size = s;
    local_50.metatype = m;
    pDVar2 = findAdd(this,&local_50);
    Datatype::~Datatype(&local_50);
    return pDVar2;
  }
  ct = getTypeArray(this,s,this->typecache[1][5]);
  pDVar2 = findAdd(this,&ct->super_Datatype);
  return pDVar2;
}

Assistant:

Datatype *TypeFactory::getBase(int4 s,type_metatype m)

{
  Datatype *ct;
  if (s<9) {
    if (m >= TYPE_FLOAT) {
      ct = typecache[s][m-TYPE_FLOAT];
      if (ct != (Datatype *)0)
	return ct;
    }
  }
  else if (m==TYPE_FLOAT) {
    if (s==10)
      ct = typecache10;
    else if (s==16)
      ct = typecache16;
    else
      ct = (Datatype *)0;
    if (ct != (Datatype *)0)
      return ct;
  }
  if (s > glb->max_basetype_size) {
    // Create array of unknown bytes to match size
    ct = typecache[1][TYPE_UNKNOWN-TYPE_FLOAT];
    ct = getTypeArray(s,ct);
    return findAdd(*ct);
  }
  TypeBase tmp(s,m);
  return findAdd(tmp);
}